

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int g_read(lua_State *L,FILE *f,int first)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  lconv *plVar9;
  ushort **ppuVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  char local_46e [2];
  uint local_46c;
  lua_State *local_468;
  char *local_460;
  ulong local_458;
  luaL_Buffer local_450;
  
  uVar11 = (ulong)(uint)first;
  iVar2 = lua_gettop(L);
  clearerr((FILE *)f);
  piVar5 = __errno_location();
  *piVar5 = 0;
  iVar12 = iVar2 + -1;
  local_458 = uVar11;
  if (iVar12 == 0) {
    uVar13 = read_line(L,f,1);
    iVar2 = first + 1;
  }
  else {
    luaL_checkstack(L,iVar2 + 0x13,"too many arguments");
    uVar13 = 1;
    local_468 = L;
    while( true ) {
      iVar2 = (int)uVar11;
      bVar14 = iVar12 == 0;
      iVar12 = iVar12 + -1;
      if ((bVar14) || (uVar13 == 0)) break;
      iVar3 = lua_type(L,iVar2);
      if (iVar3 == 3) {
        sVar6 = luaL_checkinteger(L,iVar2);
        if (sVar6 == 0) {
          iVar3 = getc((FILE *)f);
          ungetc(iVar3,(FILE *)f);
          lua_pushstring(L,"");
          bVar14 = iVar3 == -1;
        }
        else {
          luaL_buffinit(L,&local_450);
          pcVar7 = luaL_prepbuffsize(&local_450,sVar6);
          sVar8 = fread(pcVar7,1,sVar6,(FILE *)f);
          local_450.n = local_450.n + sVar8;
          luaL_pushresult(&local_450);
          bVar14 = sVar8 == 0;
        }
        uVar13 = (uint)!bVar14;
      }
      else {
        pcVar7 = luaL_checklstring(L,iVar2,(size_t *)0x0);
        cVar1 = pcVar7[*pcVar7 == '*'];
        if (cVar1 == 'L') {
          iVar3 = 0;
LAB_00114d07:
          uVar13 = read_line(L,f,iVar3);
        }
        else if (cVar1 == 'a') {
          luaL_buffinit(L,&local_450);
          do {
            pcVar7 = luaL_prepbuffsize(&local_450,0x400);
            sVar8 = fread(pcVar7,1,0x400,(FILE *)f);
            local_450.n = local_450.n + sVar8;
          } while (sVar8 == 0x400);
          luaL_pushresult(&local_450);
          uVar13 = 1;
        }
        else {
          if (cVar1 == 'l') {
            iVar3 = 1;
            goto LAB_00114d07;
          }
          if (cVar1 != 'n') {
            iVar2 = luaL_argerror(L,iVar2,"invalid format");
            return iVar2;
          }
          local_450.size._4_4_ = 0;
          local_450.b = (char *)f;
          plVar9 = localeconv();
          local_46e[0] = *plVar9->decimal_point;
          local_46e[1] = 0x2e;
          flockfile((FILE *)f);
          do {
            iVar3 = getc_unlocked((FILE *)f);
            ppuVar10 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar10 + (long)iVar3 * 2 + 1) & 0x20) != 0);
          local_450.size._0_4_ = iVar3;
          test2((RN *)&local_450,"-+");
          iVar3 = test2((RN *)&local_450,"00");
          if (iVar3 == 0) {
            uVar13 = 0;
            local_460 = "eE";
            local_46c = 0;
          }
          else {
            local_46c = test2((RN *)&local_450,"xX");
            uVar13 = local_46c ^ 1;
            local_460 = "pP";
            if (local_46c == 0) {
              local_460 = "eE";
            }
          }
          iVar3 = readdigits((RN *)&local_450,local_46c);
          iVar3 = iVar3 + uVar13;
          iVar4 = test2((RN *)&local_450,local_46e);
          if (iVar4 != 0) {
            iVar4 = readdigits((RN *)&local_450,local_46c);
            iVar3 = iVar3 + iVar4;
          }
          L = local_468;
          if ((0 < iVar3) && (iVar3 = test2((RN *)&local_450,local_460), iVar3 != 0)) {
            test2((RN *)&local_450,"-+");
            readdigits((RN *)&local_450,0);
          }
          pcVar7 = local_450.b;
          ungetc((int)local_450.size,(FILE *)local_450.b);
          funlockfile((FILE *)pcVar7);
          *(undefined1 *)((long)&local_450.n + (long)local_450.size._4_4_) = 0;
          sVar6 = lua_stringtonumber(L,(char *)&local_450.n);
          uVar13 = 1;
          if (sVar6 == 0) {
            lua_pushnil(L);
            uVar13 = 0;
          }
        }
      }
      uVar11 = (ulong)(iVar2 + 1);
    }
  }
  iVar12 = ferror((FILE *)f);
  if (iVar12 == 0) {
    if (uVar13 == 0) {
      lua_settop(L,-2);
      lua_pushnil(L);
    }
    iVar2 = iVar2 - (int)local_458;
  }
  else {
    iVar2 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar2;
}

Assistant:

static int g_read (lua_State *L, FILE *f, int first) {
  int nargs = lua_gettop(L) - 1;
  int n, success;
  clearerr(f);
  errno = 0;
  if (nargs == 0) {  /* no arguments? */
    success = read_line(L, f, 1);
    n = first + 1;  /* to return 1 result */
  }
  else {
    /* ensure stack space for all results and for auxlib's buffer */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    success = 1;
    for (n = first; nargs-- && success; n++) {
      if (lua_type(L, n) == LUA_TNUMBER) {
        size_t l = (size_t)luaL_checkinteger(L, n);
        success = (l == 0) ? test_eof(L, f) : read_chars(L, f, l);
      }
      else {
        const char *p = luaL_checkstring(L, n);
        if (*p == '*') p++;  /* skip optional '*' (for compatibility) */
        switch (*p) {
          case 'n':  /* number */
            success = read_number(L, f);
            break;
          case 'l':  /* line */
            success = read_line(L, f, 1);
            break;
          case 'L':  /* line with end-of-line */
            success = read_line(L, f, 0);
            break;
          case 'a':  /* file */
            read_all(L, f);  /* read entire file */
            success = 1; /* always success */
            break;
          default:
            return luaL_argerror(L, n, "invalid format");
        }
      }
    }
  }
  if (ferror(f))
    return luaL_fileresult(L, 0, NULL);
  if (!success) {
    lua_pop(L, 1);  /* remove last result */
    luaL_pushfail(L);  /* push nil instead */
  }
  return n - first;
}